

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxDomain.cpp
# Opt level: O2

void __thiscall amrex::BoxDomain::add(BoxDomain *this,Box *b)

{
  pointer pBVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  pointer pBVar5;
  bool bVar6;
  Box *pBVar7;
  const_iterator __first;
  Box *pBVar8;
  long lVar9;
  long lVar10;
  Box *b_00;
  pointer pBVar11;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> check;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> tmp;
  BoxList local_50;
  
  tmp.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tmp.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tmp.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  check.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  check.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  check.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
            (&check.super_vector<amrex::Box,_std::allocator<amrex::Box>_>,b);
  b_00 = (this->super_BoxList).m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data
         ._M_start;
  pBVar1 = (this->super_BoxList).m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    pBVar11 = check.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (b_00 == pBVar1) {
      BoxList::join(&this->super_BoxList,&check);
      std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&check);
      std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&tmp);
      return;
    }
    pBVar7 = check.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (tmp.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        tmp.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      tmp.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish = tmp.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    for (; pBVar5 = check.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish, pBVar7 != pBVar11; pBVar7 = pBVar7 + 1) {
      bVar6 = Box::intersects(pBVar7,b_00);
      if (bVar6) {
        boxDiff(&local_50,pBVar7,b_00);
        std::vector<amrex::Box,std::allocator<amrex::Box>>::
        insert<__gnu_cxx::__normal_iterator<amrex::Box_const*,std::vector<amrex::Box,std::allocator<amrex::Box>>>,void>
                  ((vector<amrex::Box,std::allocator<amrex::Box>> *)&tmp,
                   (const_iterator)
                   tmp.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                    )local_50.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_start,
                   (__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                    )local_50.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_finish);
        (pBVar7->smallend).vect[0] = 1;
        (pBVar7->smallend).vect[1] = 1;
        (pBVar7->smallend).vect[2] = 1;
        (pBVar7->bigend).vect[0] = 0;
        (pBVar7->bigend).vect[1] = 0;
        *(undefined8 *)((pBVar7->bigend).vect + 2) = 0;
        std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                  ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&local_50);
      }
    }
    lVar9 = (long)check.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)check.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_start;
    pBVar11 = check.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (lVar10 = lVar9 / 0x1c >> 2; 0 < lVar10; lVar10 = lVar10 + -1) {
      bVar6 = Box::isEmpty(pBVar11);
      __first._M_current = pBVar11;
      if (bVar6) goto LAB_00423d83;
      bVar6 = Box::isEmpty(pBVar11 + 1);
      __first._M_current = pBVar11 + 1;
      if (bVar6) goto LAB_00423d83;
      bVar6 = Box::isEmpty(pBVar11 + 2);
      __first._M_current = pBVar11 + 2;
      if (bVar6) goto LAB_00423d83;
      bVar6 = Box::isEmpty(pBVar11 + 3);
      __first._M_current = pBVar11 + 3;
      if (bVar6) goto LAB_00423d83;
      pBVar11 = pBVar11 + 4;
      lVar9 = lVar9 + -0x70;
    }
    lVar9 = lVar9 / 0x1c;
    if (lVar9 == 1) {
LAB_00423e02:
      bVar6 = Box::isEmpty(pBVar11);
      __first._M_current = pBVar11;
      if (!bVar6) {
        __first._M_current = pBVar5;
      }
LAB_00423d83:
      pBVar7 = __first._M_current;
      if (__first._M_current != pBVar5) {
        while (pBVar8 = pBVar7, pBVar7 = pBVar8 + 1, pBVar7 != pBVar5) {
          bVar6 = Box::isEmpty(pBVar7);
          if (!bVar6) {
            uVar2 = *(undefined8 *)(pBVar7->smallend).vect;
            uVar3 = *(undefined8 *)(pBVar8[1].smallend.vect + 2);
            uVar4 = *(undefined8 *)(pBVar8[1].bigend.vect + 2);
            *(undefined8 *)((__first._M_current)->bigend).vect =
                 *(undefined8 *)pBVar8[1].bigend.vect;
            *(undefined8 *)(((__first._M_current)->bigend).vect + 2) = uVar4;
            *(undefined8 *)((__first._M_current)->smallend).vect = uVar2;
            *(undefined8 *)(((__first._M_current)->smallend).vect + 2) = uVar3;
            __first._M_current = __first._M_current + 1;
          }
        }
      }
    }
    else {
      if (lVar9 == 2) {
LAB_00423d5a:
        bVar6 = Box::isEmpty(pBVar11);
        __first._M_current = pBVar11;
        if (!bVar6) {
          pBVar11 = pBVar11 + 1;
          goto LAB_00423e02;
        }
        goto LAB_00423d83;
      }
      __first._M_current = pBVar5;
      if (lVar9 == 3) {
        bVar6 = Box::isEmpty(pBVar11);
        __first._M_current = pBVar11;
        if (!bVar6) {
          pBVar11 = pBVar11 + 1;
          goto LAB_00423d5a;
        }
        goto LAB_00423d83;
      }
    }
    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::erase
              (&check.super_vector<amrex::Box,_std::allocator<amrex::Box>_>,__first,
               (const_iterator)
               check.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::vector<amrex::Box,std::allocator<amrex::Box>>::
    insert<__gnu_cxx::__normal_iterator<amrex::Box*,std::vector<amrex::Box,std::allocator<amrex::Box>>>,void>
              ((vector<amrex::Box,std::allocator<amrex::Box>> *)&check,
               (const_iterator)
               check.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                )tmp.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                )tmp.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    b_00 = b_00 + 1;
  } while( true );
}

Assistant:

void
BoxDomain::add (const Box& b)
{
    BL_ASSERT(b.ixType() == ixType());

    Vector<Box> tmp, check;

    check.push_back(b);

    for (const auto& bx : *this)
    {
        tmp.clear();
        for (auto& cbx : check)
        {
            if (cbx.intersects(bx))
            {
                const BoxList& tmpbl = amrex::boxDiff(cbx, bx);
                tmp.insert(std::end(tmp), std::begin(tmpbl), std::end(tmpbl));
                cbx = Box();
            }
        }
        check.erase(std::remove_if(check.begin(), check.end(),
                                   [](const Box& x) { return x.isEmpty(); }),
                    check.end());
        check.insert(std::end(check), std::begin(tmp), std::end(tmp));
    }
    join(check);
    BL_ASSERT(ok());
}